

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_font.cpp
# Opt level: O0

Weight ON_Font::FontWeightFromUnsigned(uint unsigned_font_weight)

{
  Weight local_9;
  uint unsigned_font_weight_local;
  
  switch(unsigned_font_weight) {
  case 0:
    local_9 = Unset;
    break;
  case 1:
    local_9 = Thin;
    break;
  case 2:
    local_9 = Ultralight;
    break;
  case 3:
    local_9 = Light;
    break;
  case 4:
    local_9 = Normal;
    break;
  case 5:
    local_9 = Medium;
    break;
  case 6:
    local_9 = Semibold;
    break;
  case 7:
    local_9 = Bold;
    break;
  case 8:
    local_9 = Ultrabold;
    break;
  case 9:
    local_9 = Heavy;
    break;
  default:
    ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_font.cpp"
               ,0x1a00,"","unsigned_font_weight is not valid");
    local_9 = Unset;
  }
  return local_9;
}

Assistant:

ON_Font::Weight ON_Font::FontWeightFromUnsigned(
  unsigned int unsigned_font_weight
  )
{
  switch (unsigned_font_weight)
  {
  ON_ENUM_FROM_UNSIGNED_CASE(ON_Font::Weight::Unset);
  ON_ENUM_FROM_UNSIGNED_CASE(ON_Font::Weight::Thin);
  ON_ENUM_FROM_UNSIGNED_CASE(ON_Font::Weight::Ultralight);
  ON_ENUM_FROM_UNSIGNED_CASE(ON_Font::Weight::Light);
  ON_ENUM_FROM_UNSIGNED_CASE(ON_Font::Weight::Normal);
  ON_ENUM_FROM_UNSIGNED_CASE(ON_Font::Weight::Medium);
  ON_ENUM_FROM_UNSIGNED_CASE(ON_Font::Weight::Semibold);
  ON_ENUM_FROM_UNSIGNED_CASE(ON_Font::Weight::Bold);
  ON_ENUM_FROM_UNSIGNED_CASE(ON_Font::Weight::Ultrabold);
  ON_ENUM_FROM_UNSIGNED_CASE(ON_Font::Weight::Heavy);
  default:
    break;
  }
  ON_ERROR("unsigned_font_weight is not valid");
  return ON_Font::Weight::Unset;
}